

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O3

void __thiscall StunMsg_RFC5769SampleRequest_Test::TestBody(StunMsg_RFC5769SampleRequest_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  uint32_t uVar5;
  stun_attr_varsize *psVar6;
  void *pvVar7;
  stun_attr_uint32 *attr;
  stun_attr_uint64 *attr_00;
  stun_attr_msgint *msgint;
  stun_attr_hdr *attr_hdr;
  long lVar8;
  undefined8 *puVar9;
  stun_msg_hdr *psVar10;
  char *pcVar11;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  char username [10];
  uint8_t tsx_id [12];
  char software_name [17];
  char password [23];
  uint8_t expected_result [108];
  uint8_t buffer [108];
  AssertHelper local_1a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  string local_190;
  AssertHelper local_170;
  undefined8 local_168;
  undefined2 local_160;
  uint8_t local_158 [16];
  char local_148 [32];
  uint8_t local_128 [32];
  stun_msg_hdr local_108 [5];
  undefined4 local_a0;
  stun_msg_hdr local_98 [6];
  
  builtin_strncpy(local_148,"STUN test client",0x11);
  local_168 = 0x7636683a6a747665;
  local_160 = 0x59;
  builtin_memcpy(local_128,"VOkJxbRl1RmTxUk/WvJxBt",0x17);
  puVar9 = &DAT_001498d0;
  psVar10 = local_108;
  for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar1 = *puVar9;
    psVar10->type = (short)uVar1;
    psVar10->length = (short)((ulong)uVar1 >> 0x10);
    psVar10->magic = (int)((ulong)uVar1 >> 0x20);
    puVar9 = puVar9 + 1;
    psVar10 = (stun_msg_hdr *)psVar10->tsx_id;
  }
  local_a0 = 0xcf3b7ae5;
  local_158[0] = 0xb7;
  local_158[1] = 0xe7;
  local_158[2] = 0xa7;
  local_158[3] = '\x01';
  local_158[4] = 0xbc;
  local_158[5] = '4';
  local_158[6] = 0xd6;
  local_158[7] = 0x86;
  local_158[8] = 0xfa;
  local_158[9] = 0x87;
  local_158[10] = 0xdf;
  local_158[0xb] = 0xae;
  local_1a0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000006c;
  local_1a8.data_ = (AssertHelperData *)&DAT_0000006c;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_190,"sizeof(expected_result)","sizeof(buffer)",
             (unsigned_long *)&local_1a0,(unsigned_long *)&local_1a8);
  if ((char)local_190._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1a0);
    if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)local_190._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0xa0,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    if (local_1a0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_1a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1a0.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_190._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_190._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_1a0.ptr_._0_4_ = 1;
    iVar4 = stun_msg_verify(local_108,0x6c);
    local_1a8.data_._0_4_ = iVar4;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_190,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               (int *)&local_1a0,(int *)&local_1a8);
    if ((char)local_190._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_1a0);
      if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = *(char **)local_190._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0xa2,pcVar11);
      testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      if (local_1a0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_1a0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_1a0.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_190._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_190._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      stun_msg_hdr_init(local_98,1,local_158);
      stun_attr_varsize_add(local_98,0x8022,local_148,0x10,' ');
      stun_attr_uint32_add(local_98,0x24,0x6e0001ff);
      stun_attr_uint64_add(local_98,0x8029,0x932ff9b151263b36);
      stun_attr_varsize_add(local_98,6,&local_168,9,' ');
      stun_attr_msgint_add(local_98,local_128,0x16);
      stun_attr_fingerprint_add(local_98);
      anon_unknown.dwarf_9b60::IsEqual
                ((anon_unknown_dwarf_9b60 *)&local_1a0,local_108,local_98,0x6c);
      if (local_1a0.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
        testing::Message::Message((Message *)&local_1a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_190,(internal *)&local_1a0,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb0,(char *)CONCAT71(local_190._M_dataplus._M_p._1_7_,
                                          (char)local_190._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_190._M_dataplus._M_p._1_7_,(char)local_190._M_dataplus._M_p) !=
            &local_190.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_190._M_dataplus._M_p._1_7_,(char)local_190._M_dataplus._M_p
                                  ),local_190.field_2._M_allocated_capacity + 1);
        }
        if (local_1a8.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_1a8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_1a8.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_198,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_1a0.ptr_._0_4_ = 1;
      uVar3 = stun_msg_type(local_108);
      local_1a8.data_._0_2_ = uVar3;
      testing::internal::CmpHelperEQ<stun_msg_type,unsigned_short>
                ((internal *)&local_190,"STUN_BINDING_REQUEST","stun_msg_type(msg_hdr)",
                 (stun_msg_type *)&local_1a0,(unsigned_short *)&local_1a8);
      if ((char)local_190._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_1a0);
        if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = *(char **)local_190._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb4,pcVar11);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        if (local_1a0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_1a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1a0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_190._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_1a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000006c;
      local_1a8.data_ = (AssertHelperData *)stun_msg_len(local_108);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_190,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
                 (unsigned_long *)&local_1a0,(unsigned_long *)&local_1a8);
      if ((char)local_190._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_1a0);
        if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = *(char **)local_190._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb5,pcVar11);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        if (local_1a0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_1a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1a0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_190._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      psVar6 = (stun_attr_varsize *)stun_msg_next_attr(local_108,(stun_attr_hdr *)0x0);
      local_1a0.ptr_._0_4_ = 0x8022;
      uVar3 = stun_attr_type((stun_attr_hdr *)psVar6);
      local_1a8.data_._0_2_ = uVar3;
      testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                ((internal *)&local_190,"STUN_ATTR_SOFTWARE","stun_attr_type(attr_hdr)",
                 (stun_attr_type *)&local_1a0,(unsigned_short *)&local_1a8);
      if ((char)local_190._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_1a0);
        if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = *(char **)local_190._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb8,pcVar11);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        if (local_1a0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_1a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1a0.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_190._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_1a0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010;
      local_1a8.data_ = (AssertHelperData *)stun_attr_len((stun_attr_hdr *)psVar6);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_190,"sizeof(software_name)-1","stun_attr_len(attr_hdr)",
                 (unsigned_long *)&local_1a0,(unsigned_long *)&local_1a8);
      if ((char)local_190._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_1a0);
        if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar11 = *(char **)local_190._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0xb9,pcVar11);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        if (local_1a0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_1a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1a0.ptr_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_190._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_190._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pvVar7 = stun_attr_varsize_read(psVar6);
        anon_unknown.dwarf_9b60::IsEqual
                  ((anon_unknown_dwarf_9b60 *)&local_1a0,pvVar7,local_148,0x10);
        if (local_1a0.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
          testing::Message::Message((Message *)&local_1a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_190,(internal *)&local_1a0,
                     (AssertionResult *)"IsEqual(data, software_name, sizeof(software_name)-1)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xbc,(char *)CONCAT71(local_190._M_dataplus._M_p._1_7_,
                                            (char)local_190._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a8);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_190._M_dataplus._M_p._1_7_,(char)local_190._M_dataplus._M_p) !=
              &local_190.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_190._M_dataplus._M_p._1_7_,
                                     (char)local_190._M_dataplus._M_p),
                            local_190.field_2._M_allocated_capacity + 1);
          }
          if (local_1a8.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_1a8.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_1a8.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_198,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        attr = (stun_attr_uint32 *)stun_msg_next_attr(local_108,(stun_attr_hdr *)psVar6);
        local_1a0.ptr_._0_4_ = 0x24;
        uVar3 = stun_attr_type((stun_attr_hdr *)attr);
        local_1a8.data_._0_2_ = uVar3;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&local_190,"STUN_ATTR_PRIORITY","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&local_1a0,(unsigned_short *)&local_1a8);
        if ((char)local_190._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_1a0);
          if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)local_190._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xbf,pcVar11);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_1a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_1a0.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_190._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_1a0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DAT_6e0001ff;
        uVar5 = stun_attr_uint32_read(attr);
        local_1a8.data_._0_4_ = uVar5;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)&local_190,"0x6e0001fful",
                   "stun_attr_uint32_read((stun_attr_uint32*)attr_hdr)",(unsigned_long *)&local_1a0,
                   (uint *)&local_1a8);
        if ((char)local_190._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_1a0);
          if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)local_190._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xc0,pcVar11);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_1a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_1a0.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_190._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        attr_00 = (stun_attr_uint64 *)stun_msg_next_attr(local_108,(stun_attr_hdr *)attr);
        local_1a0.ptr_._0_4_ = 0x8029;
        uVar3 = stun_attr_type((stun_attr_hdr *)attr_00);
        local_1a8.data_._0_2_ = uVar3;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&local_190,"STUN_ATTR_ICE_CONTROLLED","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&local_1a0,(unsigned_short *)&local_1a8);
        if ((char)local_190._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_1a0);
          if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)local_190._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xc3,pcVar11);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_1a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_1a0.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_190._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_1a0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DAT_932ff9b151263b36;
        local_1a8.data_ = (AssertHelperData *)stun_attr_uint64_read(attr_00);
        testing::internal::CmpHelperEQ<unsigned_long_long,unsigned_long>
                  ((internal *)&local_190,"0x932ff9b151263b36ull",
                   "stun_attr_uint64_read((stun_attr_uint64*)attr_hdr)",
                   (unsigned_long_long *)&local_1a0,(unsigned_long *)&local_1a8);
        if ((char)local_190._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_1a0);
          if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)local_190._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xc5,pcVar11);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_1a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_1a0.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_190._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        psVar6 = (stun_attr_varsize *)stun_msg_next_attr(local_108,(stun_attr_hdr *)attr_00);
        local_1a0.ptr_._0_4_ = 6;
        uVar3 = stun_attr_type((stun_attr_hdr *)psVar6);
        local_1a8.data_._0_2_ = uVar3;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&local_190,"STUN_ATTR_USERNAME","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&local_1a0,(unsigned_short *)&local_1a8);
        if ((char)local_190._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_1a0);
          if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)local_190._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,200,pcVar11);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_1a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_1a0.ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_190._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_1a0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DAT_00000009;
        local_1a8.data_ = (AssertHelperData *)stun_attr_len((stun_attr_hdr *)psVar6);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&local_190,"sizeof(username)-1","stun_attr_len(attr_hdr)",
                   (unsigned_long *)&local_1a0,(unsigned_long *)&local_1a8);
        if ((char)local_190._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_1a0);
          if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)local_190._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0xc9,pcVar11);
          testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          if (local_1a0.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_1a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_1a0.ptr_ + 8))();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_190._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_190._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          pvVar7 = stun_attr_varsize_read(psVar6);
          anon_unknown.dwarf_9b60::IsEqual
                    ((anon_unknown_dwarf_9b60 *)&local_1a0,pvVar7,&local_168,9);
          if (local_1a0.ptr_._0_1_ == (anon_unknown_dwarf_9b60)0x0) {
            testing::Message::Message((Message *)&local_1a8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_190,(internal *)&local_1a0,
                       (AssertionResult *)"IsEqual(data, username, sizeof(username)-1)","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xcb,(char *)CONCAT71(local_190._M_dataplus._M_p._1_7_,
                                              (char)local_190._M_dataplus._M_p));
            testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1a8);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_190._M_dataplus._M_p._1_7_,(char)local_190._M_dataplus._M_p) !=
                &local_190.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_190._M_dataplus._M_p._1_7_,
                                       (char)local_190._M_dataplus._M_p),
                              local_190.field_2._M_allocated_capacity + 1);
            }
            if (local_1a8.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_1a8.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_1a8.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_198,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          msgint = (stun_attr_msgint *)stun_msg_next_attr(local_108,(stun_attr_hdr *)psVar6);
          local_1a0.ptr_._0_4_ = 8;
          uVar3 = stun_attr_type((stun_attr_hdr *)msgint);
          local_1a8.data_._0_2_ = uVar3;
          testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                    ((internal *)&local_190,"STUN_ATTR_MESSAGE_INTEGRITY","stun_attr_type(attr_hdr)"
                     ,(stun_attr_type *)&local_1a0,(unsigned_short *)&local_1a8);
          if ((char)local_190._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_1a0);
            if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = *(char **)local_190._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xce,pcVar11);
            testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
            testing::internal::AssertHelper::~AssertHelper(&local_1a8);
            if (local_1a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_1a0.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_1a0.ptr_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_190._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_1a0.ptr_._0_4_ = 1;
          iVar4 = stun_attr_msgint_check(msgint,local_108,local_128,0x16);
          local_1a8.data_._0_4_ = iVar4;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_190,"1",
                     "stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr, (uint8_t*)password, sizeof(password)-1)"
                     ,(int *)&local_1a0,(int *)&local_1a8);
          if ((char)local_190._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_1a0);
            if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = *(char **)local_190._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xd0,pcVar11);
            testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
            testing::internal::AssertHelper::~AssertHelper(&local_1a8);
            if (local_1a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_1a0.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_1a0.ptr_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_190._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          attr_hdr = stun_msg_next_attr(local_108,(stun_attr_hdr *)msgint);
          local_1a0.ptr_._0_4_ = 0x8028;
          uVar3 = stun_attr_type(attr_hdr);
          local_1a8.data_._0_2_ = uVar3;
          testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                    ((internal *)&local_190,"STUN_ATTR_FINGERPRINT","stun_attr_type(attr_hdr)",
                     (stun_attr_type *)&local_1a0,(unsigned_short *)&local_1a8);
          if ((char)local_190._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_1a0);
            if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = *(char **)local_190._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xd3,pcVar11);
            testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
            testing::internal::AssertHelper::~AssertHelper(&local_1a8);
            if (local_1a0.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_1a0.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_1a0.ptr_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_190._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_1a0.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               stun_msg_next_attr(local_108,attr_hdr);
          local_1a8.data_ = (AssertHelperData *)0x0;
          testing::internal::CmpHelperEQ<_stun_attr_hdr_const*,_stun_attr_hdr_const*>
                    ((internal *)&local_190,"__null","attr_hdr",(_stun_attr_hdr **)&local_1a8,
                     (_stun_attr_hdr **)&local_1a0);
          if ((char)local_190._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_1a0);
            if ((undefined8 *)local_190._M_string_length == (undefined8 *)0x0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = *(char **)local_190._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                       ,0xd6,pcVar11);
            testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1a0);
            testing::internal::AssertHelper::~AssertHelper(&local_1a8);
            if ((stun_attr_hdr *)local_1a0.ptr_ != (stun_attr_hdr *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && ((stun_attr_hdr *)local_1a0.ptr_ != (stun_attr_hdr *)0x0)) {
                (**(code **)(*(long *)local_1a0.ptr_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_190._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(StunMsg, RFC5769SampleRequest) {
  const char software_name[] = "STUN test client";
  const char username[] = "evtj:h6vY";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x58, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x10, //    SOFTWARE attribute header
    0x53,0x54,0x55,0x4e, // }
    0x20,0x74,0x65,0x73, // }  User-agent...
    0x74,0x20,0x63,0x6c, // }  ...name
    0x69,0x65,0x6e,0x74, // }
    0x00,0x24,0x00,0x04, //    PRIORITY attribute header
    0x6e,0x00,0x01,0xff, //    ICE priority value
    0x80,0x29,0x00,0x08, //    ICE-CONTROLLED attribute header
    0x93,0x2f,0xf9,0xb1, // }  Pseudo-random tie breaker...
    0x51,0x26,0x3b,0x36, // }   ...for ICE control
    0x00,0x06,0x00,0x09, //    USERNAME attribute header
    0x65,0x76,0x74,0x6a, // }
    0x3a,0x68,0x36,0x76, // }  Username (9 bytes) and padding (3 bytes)
    0x59,0x20,0x20,0x20, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x9a,0xea,0xa7,0x0c, // }
    0xbf,0xd8,0xcb,0x56, // }
    0x78,0x1e,0xf2,0xb5, // }  HMAC-SHA1 fingerprint
    0xb2,0xd3,0xf2,0x49, // }
    0xc1,0xb5,0x71,0xa2, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xe5,0x7a,0x3b,0xcf, //    CRC0x32, fingerprint
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_VARSIZE_SIZE(sizeof(software_name) - 1)
    + STUN_ATTR_UINT32_SIZE
    + STUN_ATTR_UINT64_SIZE
    + STUN_ATTR_VARSIZE_SIZE(sizeof(username) - 1)
    + STUN_ATTR_MSGINT_SIZE
    + STUN_ATTR_FINGERPRINT_SIZE];

  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  stun_msg_hdr_init(msg_hdr, STUN_BINDING_REQUEST, tsx_id);  
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_SOFTWARE, software_name,
        sizeof(software_name)-1, ' ');
  stun_attr_uint32_add(msg_hdr, STUN_ATTR_PRIORITY, 0x6e0001fful);
  stun_attr_uint64_add(msg_hdr, STUN_ATTR_ICE_CONTROLLED, 0x932ff9b151263b36ull);
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_USERNAME, username,
        sizeof(username)-1, ' ');
  stun_attr_msgint_add(msg_hdr, password, sizeof(password)-1);
  stun_attr_fingerprint_add(msg_hdr);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_REQUEST, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_SOFTWARE, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(software_name)-1, stun_attr_len(attr_hdr));
  const void* data = (uint8_t*)stun_attr_varsize_read(
    (stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, software_name, sizeof(software_name)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_PRIORITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(0x6e0001fful, stun_attr_uint32_read((stun_attr_uint32*)attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_ICE_CONTROLLED, stun_attr_type(attr_hdr));
  EXPECT_EQ(0x932ff9b151263b36ull,
      stun_attr_uint64_read((stun_attr_uint64*)attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_USERNAME, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(username)-1, stun_attr_len(attr_hdr));
  data = stun_attr_varsize_read((stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, username, sizeof(username)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_MESSAGE_INTEGRITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(1, stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr,
      (uint8_t*)password, sizeof(password)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_FINGERPRINT, stun_attr_type(attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}